

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

BaseNode * __thiscall
asmjit::_abi_1_10::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  bool bVar1;
  BaseNode *pBVar2;
  BaseNode *in_RDX;
  BaseNode *in_RSI;
  BaseNode *in_RDI;
  BaseNode *next;
  BaseNode *prev;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  NodeFlags in_stack_ffffffffffffffcf;
  
  if ((in_RSI->field_0).field_0._prev != (BaseNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if ((in_RSI->field_0).field_0._next != (BaseNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  bVar1 = BaseNode::isActive((BaseNode *)0x114030);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  bVar1 = BaseNode::isActive((BaseNode *)0x114062);
  if (bVar1) {
    pBVar2 = BaseNode::prev(in_RDX);
    (in_RSI->field_0).field_0._prev = pBVar2;
    (in_RSI->field_0).field_0._next = in_RDX;
    BaseNode::addFlags(in_RDI,in_stack_ffffffffffffffcf);
    bVar1 = BaseNode::isSection((BaseNode *)0x1140d3);
    if (bVar1) {
      *(undefined1 *)((long)&in_RDI[8].field_3 + 1) = 1;
    }
    (in_RDX->field_0).field_0._prev = in_RSI;
    if (pBVar2 == (BaseNode *)0x0) {
      in_RDI[8].field_0.field_0._next = in_RSI;
    }
    else {
      (pBVar2->field_0).field_0._next = in_RSI;
    }
    return in_RSI;
  }
  DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}